

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

string * testing::PrintToString<GMM_TILE_MODE_ENUM>
                   (string *__return_storage_ptr__,GMM_TILE_MODE_ENUM *value)

{
  long in_FS_OFFSET;
  stringstream local_1a8 [8];
  stringstream ss;
  undefined1 local_198 [112];
  ios_base local_128 [264];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::ostream::_M_insert<long_long>((longlong)local_198);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

::std::string PrintToString(const T& value) {
        ::std::stringstream ss;
        internal::UniversalTersePrinter<T>::Print(value, &ss);
        return ss.str();
    }